

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_mir_fold.hpp
# Opt level: O0

void __thiscall
optimization::var_mir_fold::VarMirFold::optimize_func
          (VarMirFold *this,string *name,MirFunction *mirFunction)

{
  VarId *pVVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  VarId *pVVar5;
  OpInst *opInst;
  Inst *inst;
  size_t i;
  iterator blksIter;
  Value *in_stack_fffffffffffffda8;
  VarMirFold *in_stack_fffffffffffffdb0;
  VarId *in_stack_fffffffffffffdb8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *in_stack_fffffffffffffdc0;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *in_stack_fffffffffffffdf8;
  Value *in_stack_fffffffffffffe00;
  VarId *in_stack_fffffffffffffe08;
  VarMirFold *in_stack_fffffffffffffe10;
  undefined1 local_110 [64];
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> local_d0;
  VarMirFold local_c8 [3];
  pointer local_40;
  pointer local_38;
  VarId *local_30;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffda8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffda8);
    bVar2 = std::operator!=(local_20,&local_28);
    if (!bVar2) break;
    local_30 = (VarId *)0x0;
    while( true ) {
      pVVar1 = local_30;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1408b8)
      ;
      pVVar5 = (VarId *)std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::size(&(ppVar4->second).inst);
      if (pVVar5 <= pVVar1) break;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1408e9);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
      local_38 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffffdb0);
      iVar3 = (*(local_38->super_Displayable)._vptr_Displayable[1])();
      if (iVar3 == 1) {
        local_40 = local_38;
        switch(local_38[3].dest.id) {
        case 0:
          bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          if (bVar2) {
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1409b9);
            std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
            unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                      (in_stack_fffffffffffffdc0,
                       (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        *)in_stack_fffffffffffffdb8);
            replaceInst(in_stack_fffffffffffffe10,
                        (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                      (in_stack_fffffffffffffdc0);
            std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                         *)in_stack_fffffffffffffdb0);
          }
          else {
            bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
            if (bVar2) {
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x140ac4);
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                        (in_stack_fffffffffffffdc0,
                         (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                          *)in_stack_fffffffffffffdb8);
              replaceInst(in_stack_fffffffffffffe10,
                          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        (in_stack_fffffffffffffdc0);
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)in_stack_fffffffffffffdb0);
            }
          }
          break;
        case 1:
          bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          if (bVar2) {
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x140bd3);
            std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
            unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                      (in_stack_fffffffffffffdc0,
                       (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        *)in_stack_fffffffffffffdb8);
            replaceInst(in_stack_fffffffffffffe10,
                        (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                      (in_stack_fffffffffffffdc0);
            std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                         *)in_stack_fffffffffffffdb0);
          }
          break;
        case 2:
          bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          if ((bVar2) ||
             (bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0),
             bVar2)) {
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x140cff);
            mir::inst::Value::Value
                      ((Value *)in_stack_fffffffffffffdb0,
                       (int32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20));
            std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
            unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                      (in_stack_fffffffffffffdc0,
                       (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        *)in_stack_fffffffffffffdb8);
            replaceInst(in_stack_fffffffffffffe10,
                        (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                      (in_stack_fffffffffffffdc0);
            std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                         *)in_stack_fffffffffffffdb0);
          }
          else {
            bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
            if (bVar2) {
              std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x140e35);
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                        (in_stack_fffffffffffffdc0,
                         (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                          *)in_stack_fffffffffffffdb8);
              replaceInst(in_stack_fffffffffffffe10,
                          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        (in_stack_fffffffffffffdc0);
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)in_stack_fffffffffffffdb0);
            }
            else {
              bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
              if (bVar2) {
                ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::
                         operator->((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *
                                    )0x140f37);
                in_stack_fffffffffffffe00 = (Value *)&(ppVar4->second).inst;
                in_stack_fffffffffffffdf8 = &local_d0;
                in_stack_fffffffffffffe08 = local_30;
                std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                          (local_30,in_stack_fffffffffffffe00);
                in_stack_fffffffffffffe10 = local_c8;
                std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
                unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                          (in_stack_fffffffffffffdc0,
                           (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                            *)in_stack_fffffffffffffdb8);
                replaceInst(in_stack_fffffffffffffe10,
                            (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                            in_stack_fffffffffffffdf8);
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                          (in_stack_fffffffffffffdc0);
                std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                               *)in_stack_fffffffffffffdb0);
              }
            }
          }
          break;
        case 3:
          bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
          if (bVar2) {
            std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x141030);
            mir::inst::Value::Value
                      ((Value *)in_stack_fffffffffffffdb0,
                       (int32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20));
            std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
            unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                      (in_stack_fffffffffffffdc0,
                       (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        *)in_stack_fffffffffffffdb8);
            replaceInst(in_stack_fffffffffffffe10,
                        (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
            std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                      (in_stack_fffffffffffffdc0);
            std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                         *)in_stack_fffffffffffffdb0);
          }
          else {
            bVar2 = isSpecifyImmediate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
            if (bVar2) {
              ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::
                       operator->((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                                  0x141142);
              in_stack_fffffffffffffdb0 = (VarMirFold *)&(ppVar4->second).inst;
              in_stack_fffffffffffffda8 = (Value *)local_110;
              in_stack_fffffffffffffdb8 = local_30;
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
              in_stack_fffffffffffffdc0 =
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   (local_110 + 8);
              std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
              unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                        (in_stack_fffffffffffffdc0,
                         (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                          *)in_stack_fffffffffffffdb8);
              replaceInst(in_stack_fffffffffffffe10,
                          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8);
              std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                        (in_stack_fffffffffffffdc0);
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)in_stack_fffffffffffffdb0);
            }
          }
          break;
        default:
          break;
        case 5:
        }
      }
      local_30 = (VarId *)((long)&(local_30->super_Displayable)._vptr_Displayable + 1);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  }
  return;
}

Assistant:

void optimize_func(const std::string& name,
                     mir::inst::MirFunction& mirFunction) {
    for (auto blksIter = mirFunction.basic_blks.begin();
         blksIter != mirFunction.basic_blks.end(); blksIter++) {
      for (size_t i = 0; i < blksIter->second.inst.size(); i++) {
        mir::inst::Inst* inst =
            blksIter->second.inst.at(i).get();
        switch (inst->inst_kind()) {
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*) inst;
            switch (opInst->op) {
              case mir::inst::Op::Add: {
                if (isSpecifyImmediate(opInst->lhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->rhs));
                } else if (isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Sub: {
                if (isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Mul: {
                if (isSpecifyImmediate(opInst->lhs, 0) ||
                    isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, mir::inst::Value(0)));
                } else if (isSpecifyImmediate(opInst->lhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->rhs));
                } else if (isSpecifyImmediate(opInst->rhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Div: {
                if (isSpecifyImmediate(opInst->lhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, mir::inst::Value(0)));
                } else if (isSpecifyImmediate(opInst->rhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Rem: {
                break;
              }
              default:
                break;
            }
            break;
          }
          case mir::inst::InstKind::PtrOffset: {
            break;
          }
          default:
            break;
        }
      }
    }
  }